

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Transpose<3,_3>::doApply
          (IRet *__return_storage_ptr__,Transpose<3,_3> *this,EvalContext *param_1,IArgs *iargs)

{
  bool *pbVar1;
  double dVar2;
  Vector<tcu::Interval,_3> *pVVar3;
  long lVar4;
  Vector<tcu::Interval,_3> *pVVar5;
  Vector<tcu::Interval,_3> *pVVar6;
  long lVar7;
  
  tcu::Matrix<tcu::Interval,_3,_3>::Matrix(__return_storage_ptr__);
  pVVar3 = (Vector<tcu::Interval,_3> *)iargs->a;
  pVVar5 = (Vector<tcu::Interval,_3> *)__return_storage_ptr__;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    pVVar6 = pVVar5;
    for (lVar7 = 0; lVar7 != 0x48; lVar7 = lVar7 + 0x18) {
      ((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)pVVar6->m_data)->m_data[0].m_data[0].m_hi =
           *(double *)
            ((long)&((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)pVVar3->m_data)->m_data[0].m_data
                    [0].m_hi + lVar7);
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)pVVar3->m_data)->m_data[0].m_data[0].
                m_hasNaN + lVar7;
      dVar2 = *(double *)(pbVar1 + 8);
      *(undefined8 *)((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)pVVar6->m_data)->m_data[0].m_data
           = *(undefined8 *)pbVar1;
      ((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)pVVar6->m_data)->m_data[0].m_data[0].m_lo = dVar2
      ;
      pVVar6 = pVVar6 + 1;
    }
    pVVar3 = pVVar3 + 1;
    pVVar5 = (Vector<tcu::Interval,_3> *)(pVVar5->m_data + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&, const IArgs& iargs) const
	{
		IRet ret;

		for (int rowNdx = 0; rowNdx < Rows; ++rowNdx)
		{
			for (int colNdx = 0; colNdx < Columns; ++colNdx)
				ret(rowNdx, colNdx) = iargs.a(colNdx, rowNdx);
		}

		return ret;
	}